

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_opengl.h
# Opt level: O2

djg_mesh * djgm_load_plane(int slices,int stacks)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  djg_mesh *__ptr;
  djgm_vertex *pdVar4;
  uint16_t *puVar5;
  uint16_t *puVar6;
  ulong uVar7;
  ulong uVar8;
  uint16_t uVar9;
  uint uVar10;
  uint uVar11;
  djgm_vertex *pdVar12;
  uint16_t *puVar13;
  int iVar14;
  djgm_vertex *pdVar15;
  ulong uVar16;
  int iVar17;
  int iVar18;
  uint16_t *puVar19;
  uint16_t uVar20;
  int iVar21;
  int iVar22;
  ulong uVar23;
  long lVar24;
  bool bVar25;
  float fVar26;
  float fVar27;
  
  __ptr = (djg_mesh *)malloc(0x28);
  if (__ptr == (djg_mesh *)0x0) {
    __assert_fail("mesh",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/dj_opengl/dj_opengl.h"
                  ,0x5fc,"djg_mesh *djgm__create()");
  }
  __ptr->poly4c = 0;
  __ptr->poly4v = (uint16_t *)0x0;
  __ptr->vertexc = 0;
  __ptr->poly3c = 0;
  __ptr->vertexv = (djgm_vertex *)0x0;
  __ptr->poly3v = (uint16_t *)0x0;
  if ((stacks | slices) < 0) {
    __assert_fail("slices >= 0 && stacks >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/dj_opengl/dj_opengl.h"
                  ,0x674,"djg_mesh *djgm_load_plane(int, int)");
  }
  uVar3 = slices + 2;
  uVar1 = stacks + 2;
  uVar10 = uVar1 * uVar3;
  if ((int)uVar10 < 0x10000) {
    pdVar4 = (djgm_vertex *)malloc((ulong)uVar10 << 6);
    iVar2 = slices + 1;
    uVar7 = 0;
    uVar8 = 0;
    if (0 < (int)uVar1) {
      uVar8 = (ulong)uVar1;
    }
    pdVar12 = pdVar4;
    uVar23 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      uVar23 = uVar7;
    }
    for (; uVar7 != uVar23; uVar7 = uVar7 + 1) {
      fVar26 = (float)(int)uVar7 / (float)iVar2;
      pdVar15 = pdVar12;
      for (uVar16 = 0; uVar8 != uVar16; uVar16 = uVar16 + 1) {
        (pdVar15->st).s = fVar26;
        fVar27 = (float)(int)uVar16 / (float)(stacks + 1);
        (pdVar15->st).t = fVar27;
        (pdVar15->st).p = 0.0;
        (pdVar15->st).q = 0.0;
        (pdVar15->p).x = fVar26;
        (pdVar15->p).y = fVar27;
        (pdVar15->p).z = 0.0;
        (pdVar15->p).w = 1.0;
        (pdVar15->dpds).x = 1.0;
        (pdVar15->dpds).y = 0.0;
        (pdVar15->dpds).z = 0.0;
        *(undefined8 *)&(pdVar15->dpds).w = 0;
        (pdVar15->dpdt).y = 1.0;
        (pdVar15->dpdt).z = 0.0;
        (pdVar15->dpdt).w = 0.0;
        pdVar15 = pdVar15 + 1;
      }
      pdVar12 = pdVar12 + (int)uVar1;
    }
    __ptr->vertexv = pdVar4;
    __ptr->vertexc = uVar10;
    iVar17 = (stacks + 1) * iVar2;
    uVar3 = iVar17 * 6;
    uVar10 = iVar17 * 4;
    puVar5 = (uint16_t *)malloc((ulong)uVar3 * 2);
    puVar6 = (uint16_t *)malloc((ulong)uVar10 * 2);
    if (slices < 0) {
      slices = -1;
    }
    iVar17 = -1;
    if (-1 < stacks) {
      iVar17 = stacks;
    }
    iVar22 = stacks + 3;
    puVar13 = puVar5 + 5;
    uVar7 = 0;
    while (uVar7 != (long)iVar17 + 1U) {
      uVar8 = uVar7 & 0xffffffff;
      uVar7 = uVar7 + 1;
      puVar19 = puVar13;
      lVar24 = (long)slices + 1;
      while (bVar25 = lVar24 != 0, lVar24 = lVar24 + -1, bVar25) {
        uVar20 = (uint16_t)uVar8;
        puVar19[-5] = uVar20;
        uVar11 = (int)uVar8 + uVar1;
        uVar9 = (uint16_t)uVar11;
        puVar19[-4] = uVar9;
        puVar19[-3] = uVar20 + 1;
        puVar19[-2] = uVar20 + 1;
        puVar19[-1] = uVar9;
        *puVar19 = uVar20 + (short)iVar22;
        puVar19 = puVar19 + 6;
        uVar8 = (ulong)uVar11;
      }
      puVar13 = puVar13 + (long)iVar2 * 6;
    }
    puVar13 = puVar6 + 3;
    iVar14 = 1;
    uVar7 = 0;
    while (uVar7 != (long)iVar17 + 1U) {
      uVar7 = uVar7 + 1;
      iVar18 = iVar14;
      iVar21 = iVar22;
      for (lVar24 = 0; (long)slices + 1 != lVar24; lVar24 = lVar24 + 1) {
        puVar13[lVar24 * 4 + -3] = (uint16_t)iVar18 - 1;
        puVar13[lVar24 * 4 + -2] = (uint16_t)iVar21 - 1;
        puVar13[lVar24 * 4 + -1] = (uint16_t)iVar21;
        puVar13[lVar24 * 4] = (uint16_t)iVar18;
        iVar21 = iVar21 + uVar1;
        iVar18 = iVar18 + uVar1;
      }
      iVar22 = iVar22 + 1;
      iVar14 = iVar14 + 1;
      puVar13 = puVar13 + (long)iVar2 * 4;
    }
    __ptr->poly3c = uVar3;
    __ptr->poly4c = uVar10;
    __ptr->poly3v = puVar5;
    __ptr->poly4v = puVar6;
  }
  else {
    fwrite("djg_error: Too many vertices\n",0x1d,1,_stdout);
    fflush(_stdout);
    free(__ptr);
    __ptr = (djg_mesh *)0x0;
  }
  return __ptr;
}

Assistant:

DJGDEF djg_mesh *
djgm_load_plane(int slices, int stacks)
{
    djg_mesh *mesh = djgm__create();

    DJG_ASSERT(slices >= 0 && stacks >= 0);
    if (!djgm__load_plane_vertices(mesh, slices, stacks)) {
        DJG_FREE(mesh);

        return NULL;
    }
    if (!djgm__load_plane_polygons(mesh, slices, stacks)) {
        DJG_FREE(mesh->vertexv);
        DJG_FREE(mesh);

        return NULL;
    }

    return mesh;
}